

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O1

void __thiscall
btAxisSweep3Internal<unsigned_short>::calculateOverlappingPairs
          (btAxisSweep3Internal<unsigned_short> *this,btDispatcher *dispatcher)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  int iVar5;
  int iVar6;
  btBroadphasePair *pbVar7;
  btBroadphaseProxy *pbVar8;
  btBroadphaseProxy *pbVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined8 uVar13;
  ulong uVar14;
  int iVar15;
  btAlignedObjectArray<btBroadphasePair> *this_00;
  btBroadphasePair *pbVar16;
  long lVar17;
  ulong uVar18;
  Handle *pHandleB;
  btBroadphaseProxy *pbVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  Handle *pHandleA;
  btBroadphaseProxy *pbVar23;
  btBroadphasePairSortPredicate local_3a;
  btBroadphasePairSortPredicate local_39;
  btDispatcher *local_38;
  undefined4 extraout_var;
  
  local_38 = dispatcher;
  iVar15 = (*(this->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback
             [0xe])();
  if ((char)iVar15 != '\0') {
    iVar15 = (*(this->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback
               [7])();
    this_00 = (btAlignedObjectArray<btBroadphasePair> *)CONCAT44(extraout_var,iVar15);
    if (1 < this_00->m_size) {
      btAlignedObjectArray<btBroadphasePair>::quickSortInternal<btBroadphasePairSortPredicate>
                (this_00,&local_39,0,this_00->m_size + -1);
    }
    iVar15 = this_00->m_size;
    iVar5 = this->m_invalidPair;
    lVar22 = (long)iVar5;
    lVar21 = iVar15 - lVar22;
    iVar20 = (int)lVar21;
    if ((lVar22 < 1) && (iVar5 < 0)) {
      if (this_00->m_capacity < iVar20) {
        if (iVar15 == iVar5) {
          pbVar16 = (btBroadphasePair *)0x0;
        }
        else {
          pbVar16 = (btBroadphasePair *)btAlignedAllocInternal(lVar21 * 0x20,0x10);
        }
        iVar6 = this_00->m_size;
        if (0 < (long)iVar6) {
          lVar17 = 0;
          do {
            pbVar7 = this_00->m_data;
            puVar1 = (undefined4 *)((long)&pbVar7->m_pProxy0 + lVar17);
            uVar10 = puVar1[1];
            uVar11 = puVar1[2];
            uVar12 = puVar1[3];
            puVar2 = (undefined4 *)((long)&pbVar16->m_pProxy0 + lVar17);
            *puVar2 = *puVar1;
            puVar2[1] = uVar10;
            puVar2[2] = uVar11;
            puVar2[3] = uVar12;
            *(undefined8 *)((long)&pbVar16->m_algorithm + lVar17) =
                 *(undefined8 *)((long)&pbVar7->m_algorithm + lVar17);
            *(undefined8 *)((long)&pbVar16->field_3 + lVar17) =
                 *(undefined8 *)((long)&pbVar7->field_3 + lVar17);
            lVar17 = lVar17 + 0x20;
          } while ((long)iVar6 * 0x20 != lVar17);
        }
        if (this_00->m_data != (btBroadphasePair *)0x0) {
          if (this_00->m_ownsMemory == true) {
            btAlignedFreeInternal(this_00->m_data);
          }
          this_00->m_data = (btBroadphasePair *)0x0;
        }
        this_00->m_ownsMemory = true;
        this_00->m_data = pbVar16;
        this_00->m_capacity = iVar20;
      }
      if (iVar5 < 0) {
        lVar17 = (long)iVar15 << 5;
        do {
          pbVar16 = this_00->m_data;
          puVar4 = (undefined8 *)((long)&pbVar16->m_algorithm + lVar17);
          *puVar4 = 0;
          puVar4[1] = 0;
          puVar4 = (undefined8 *)((long)&pbVar16->m_pProxy0 + lVar17);
          *puVar4 = 0;
          puVar4[1] = 0;
          lVar17 = lVar17 + 0x20;
          lVar22 = lVar22 + 1;
        } while (lVar22 != 0);
      }
    }
    this_00->m_size = iVar20;
    this->m_invalidPair = 0;
    if (0 < iVar20) {
      lVar22 = 0;
      pbVar19 = (btBroadphaseProxy *)0x0;
      pbVar23 = (btBroadphaseProxy *)0x0;
      do {
        pbVar16 = this_00->m_data;
        pbVar8 = pbVar16[lVar22].m_pProxy0;
        pbVar9 = pbVar16[lVar22].m_pProxy1;
        if (((pbVar19 == pbVar9 && pbVar23 == pbVar8) ||
            (*(ushort *)((long)&pbVar8[1].m_clientObject + 2) < *(ushort *)&pbVar9->field_0x3c)) ||
           (*(ushort *)((long)&pbVar9[1].m_clientObject + 2) < *(ushort *)&pbVar8->field_0x3c)) {
LAB_0013151b:
          pbVar16 = pbVar16 + lVar22;
          (*(this->m_pairCache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback[8])
                    (this->m_pairCache,pbVar16,local_38);
          pbVar16->m_pProxy0 = (btBroadphaseProxy *)0x0;
          pbVar16->m_pProxy1 = (btBroadphaseProxy *)0x0;
          this->m_invalidPair = this->m_invalidPair + 1;
          gOverlappingPairs = gOverlappingPairs + -1;
        }
        else {
          uVar14 = 0;
          do {
            uVar18 = uVar14;
            if ((uVar18 == 2) ||
               (*(ushort *)((long)pbVar8[1].m_aabbMin.m_floats + uVar18 * 2 + -0x18) <
                *(ushort *)((long)(&pbVar9->m_aabbMax + 1) + uVar18 * 2 + 2))) break;
            uVar14 = uVar18 + 1;
          } while (*(ushort *)((long)(&pbVar8->m_aabbMax + 1) + uVar18 * 2 + 2) <=
                   *(ushort *)((long)pbVar9[1].m_aabbMin.m_floats + uVar18 * 2 + -0x18));
          if (uVar18 < 2) goto LAB_0013151b;
        }
        lVar22 = lVar22 + 1;
        lVar21 = (long)this_00->m_size;
        pbVar19 = pbVar9;
        pbVar23 = pbVar8;
      } while (lVar22 < lVar21);
    }
    if (1 < (int)lVar21) {
      btAlignedObjectArray<btBroadphasePair>::quickSortInternal<btBroadphasePairSortPredicate>
                (this_00,&local_3a,0,(int)lVar21 + -1);
    }
    iVar15 = this_00->m_size;
    iVar5 = this->m_invalidPair;
    lVar21 = (long)iVar5;
    lVar22 = iVar15 - lVar21;
    iVar20 = (int)lVar22;
    if ((lVar21 < 1) && (iVar5 < 0)) {
      if (this_00->m_capacity < iVar20) {
        if (iVar15 == iVar5) {
          pbVar16 = (btBroadphasePair *)0x0;
        }
        else {
          pbVar16 = (btBroadphasePair *)btAlignedAllocInternal(lVar22 * 0x20,0x10);
        }
        iVar6 = this_00->m_size;
        if (0 < (long)iVar6) {
          lVar22 = 0;
          do {
            pbVar7 = this_00->m_data;
            puVar4 = (undefined8 *)((long)&pbVar7->m_pProxy0 + lVar22);
            uVar13 = puVar4[1];
            puVar3 = (undefined8 *)((long)&pbVar16->m_pProxy0 + lVar22);
            *puVar3 = *puVar4;
            puVar3[1] = uVar13;
            *(undefined8 *)((long)&pbVar16->m_algorithm + lVar22) =
                 *(undefined8 *)((long)&pbVar7->m_algorithm + lVar22);
            *(undefined8 *)((long)&pbVar16->field_3 + lVar22) =
                 *(undefined8 *)((long)&pbVar7->field_3 + lVar22);
            lVar22 = lVar22 + 0x20;
          } while ((long)iVar6 * 0x20 != lVar22);
        }
        if (this_00->m_data != (btBroadphasePair *)0x0) {
          if (this_00->m_ownsMemory == true) {
            btAlignedFreeInternal(this_00->m_data);
          }
          this_00->m_data = (btBroadphasePair *)0x0;
        }
        this_00->m_ownsMemory = true;
        this_00->m_data = pbVar16;
        this_00->m_capacity = iVar20;
      }
      if (iVar5 < 0) {
        lVar22 = (long)iVar15 << 5;
        do {
          pbVar16 = this_00->m_data;
          puVar4 = (undefined8 *)((long)&pbVar16->m_algorithm + lVar22);
          *puVar4 = 0;
          puVar4[1] = 0;
          puVar4 = (undefined8 *)((long)&pbVar16->m_pProxy0 + lVar22);
          *puVar4 = 0;
          puVar4[1] = 0;
          lVar22 = lVar22 + 0x20;
          lVar21 = lVar21 + 1;
        } while (lVar21 != 0);
      }
    }
    this_00->m_size = iVar20;
    this->m_invalidPair = 0;
  }
  return;
}

Assistant:

void	btAxisSweep3Internal<BP_FP_INT_TYPE>::calculateOverlappingPairs(btDispatcher* dispatcher)
{

	if (m_pairCache->hasDeferredRemoval())
	{
	
		btBroadphasePairArray&	overlappingPairArray = m_pairCache->getOverlappingPairArray();

		//perform a sort, to find duplicates and to sort 'invalid' pairs to the end
		overlappingPairArray.quickSort(btBroadphasePairSortPredicate());

		overlappingPairArray.resize(overlappingPairArray.size() - m_invalidPair);
		m_invalidPair = 0;

		
		int i;

		btBroadphasePair previousPair;
		previousPair.m_pProxy0 = 0;
		previousPair.m_pProxy1 = 0;
		previousPair.m_algorithm = 0;
		
		
		for (i=0;i<overlappingPairArray.size();i++)
		{
		
			btBroadphasePair& pair = overlappingPairArray[i];

			bool isDuplicate = (pair == previousPair);

			previousPair = pair;

			bool needsRemoval = false;

			if (!isDuplicate)
			{
				///important to use an AABB test that is consistent with the broadphase
				bool hasOverlap = testAabbOverlap(pair.m_pProxy0,pair.m_pProxy1);

				if (hasOverlap)
				{
					needsRemoval = false;//callback->processOverlap(pair);
				} else
				{
					needsRemoval = true;
				}
			} else
			{
				//remove duplicate
				needsRemoval = true;
				//should have no algorithm
				btAssert(!pair.m_algorithm);
			}
			
			if (needsRemoval)
			{
				m_pairCache->cleanOverlappingPair(pair,dispatcher);

		//		m_overlappingPairArray.swap(i,m_overlappingPairArray.size()-1);
		//		m_overlappingPairArray.pop_back();
				pair.m_pProxy0 = 0;
				pair.m_pProxy1 = 0;
				m_invalidPair++;
				gOverlappingPairs--;
			} 
			
		}

	///if you don't like to skip the invalid pairs in the array, execute following code:
	#define CLEAN_INVALID_PAIRS 1
	#ifdef CLEAN_INVALID_PAIRS

		//perform a sort, to sort 'invalid' pairs to the end
		overlappingPairArray.quickSort(btBroadphasePairSortPredicate());

		overlappingPairArray.resize(overlappingPairArray.size() - m_invalidPair);
		m_invalidPair = 0;
	#endif//CLEAN_INVALID_PAIRS
		
		//printf("overlappingPairArray.size()=%d\n",overlappingPairArray.size());
	}

}